

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsum.c
# Opt level: O0

bool_t bsumHidIsValid(size_t hid)

{
  undefined1 auVar1 [16];
  undefined1 local_a;
  undefined1 local_9;
  size_t hid_local;
  
  local_9 = true;
  if ((hid != 0) && ((0x200 < hid || (local_9 = true, (hid & 0x1f) != 0)))) {
    local_a = false;
    if ((hid % 10 != 0) &&
       (((local_a = false, hid % 10 < 3 &&
         (auVar1._8_8_ = 0, auVar1._0_8_ = hid, local_a = false,
         (auVar1 / ZEXT816(10) & (undefined1  [16])0x7f) == (undefined1  [16])0x0)) &&
        (local_a = false, 1 < hid / 0x500)))) {
      local_a = hid / 0x500 < 5;
    }
    local_9 = local_a;
  }
  return (bool_t)local_9;
}

Assistant:

static bool_t bsumHidIsValid(size_t hid)
{
	return hid == 0 ||
		(hid <= 512 && hid % 32 == 0) ||
		(hid % 10 != 0 && hid % 10 <= 2 &&
			(hid / 10) % 128 == 0 && 2 <= hid / 1280 && hid / 1280 <= 4);
}